

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::anon_unknown_37::FailureTest::~FailureTest(FailureTest *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__FailureTest_00203400;
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  CodeLocation::~CodeLocation((CodeLocation *)0x1ad668);
  Test::~Test((Test *)0x1ad672);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}